

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLTest_SessionDuplication_Test::TestBody
          (SSLTest_SessionDuplication_Test *this)

{
  bool bVar1;
  int iVar2;
  SSL_METHOD *meth;
  SSL_METHOD *method;
  SSL_SESSION *session;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  char *in_R9;
  char *pcVar3;
  pointer *__ptr;
  UniquePtr<SSL> client;
  UniquePtr<SSL_SESSION> session1;
  UniquePtr<uint8_t> free_s1;
  UniquePtr<uint8_t> free_s0;
  uint8_t *s0_bytes;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_CTX> client_ctx;
  UniquePtr<SSL> server;
  size_t s1_len;
  size_t s0_len;
  uint8_t *s1_bytes;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  Bytes local_d0;
  _Head_base<0UL,_ssl_st_*,_false> local_c0;
  _Head_base<0UL,_ssl_session_st_*,_false> local_b8;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_40;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_38;
  _Head_base<0UL,_ssl_st_*,_false> local_30;
  size_t local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18;
  
  meth = (SSL_METHOD *)TLS_method();
  local_38._M_head_impl = (ssl_ctx_st *)SSL_CTX_new(meth);
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&local_40,method);
  local_e0[0] = (internal)(local_38._M_head_impl != (SSL_CTX *)0x0);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38._M_head_impl == (SSL_CTX *)0x0) {
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_e0,(AssertionResult *)"client_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd04,(char *)local_98);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
  }
  else {
    local_e0[0] = (internal)
                  (local_40._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_40._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      local_c0._M_head_impl = (ssl_st *)0x0;
      local_30._M_head_impl = (ssl_st *)0x0;
      local_88._8_8_ = 0;
      local_78._8_8_ = 0;
      sStack_60 = 0;
      local_58._8_8_ = 0;
      local_98 = (undefined1  [8])0x0;
      pbStack_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78._M_allocated_capacity = 0;
      local_58._M_allocated_capacity = 0;
      local_48._0_4_ = 0;
      local_48._4_1_ = false;
      local_48._5_3_ = 0;
      pcVar3 = (char *)0x1;
      local_88._M_allocated_capacity = (size_type)&local_78;
      local_68._M_p = (pointer)&local_58;
      bVar1 = ConnectClientAndServer
                        ((UniquePtr<SSL> *)&local_c0,(UniquePtr<SSL> *)&local_30,
                         local_38._M_head_impl,
                         (SSL_CTX *)
                         local_40._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         (ClientConfig *)local_98,true);
      local_e0[0] = (internal)bVar1;
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_p != &local_58) {
        operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_allocated_capacity != &local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
      }
      if (local_e0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_98,(internal *)local_e0,
                   (AssertionResult *)
                   "ConnectClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())",
                   "false","true",pcVar3);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xd09,(char *)local_98);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
        if (local_98 != (undefined1  [8])&local_88) {
          operator_delete((void *)local_98,(ulong)(local_88._M_allocated_capacity + 1));
        }
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_d0.span_.data_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_d0.span_.data_ + 8))();
        }
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
      }
      else {
        if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d8,local_d8);
        }
        session = SSL_get_session((SSL *)local_c0._M_head_impl);
        SSL_SESSION_dup((bssl *)&local_b8,(SSL_SESSION *)session,3);
        local_e0[0] = (internal)(local_b8._M_head_impl != (SSL_SESSION *)0x0);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_b8._M_head_impl == (SSL_SESSION *)0x0) {
          testing::Message::Message((Message *)&local_d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_98,(internal *)local_e0,(AssertionResult *)0x33e581,"false",
                     "true",pcVar3);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xd0e,(char *)local_98);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_d0)
          ;
          this_00 = &local_a0;
LAB_0017d655:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          if (local_98 != (undefined1  [8])&local_88) {
            operator_delete((void *)local_98,(ulong)(local_88._M_allocated_capacity + 1));
          }
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_d0.span_.data_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_d0.span_.data_ + 8))();
          }
          if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_d8,local_d8);
          }
        }
        else {
          (local_b8._M_head_impl)->field_0x1b8 = (local_b8._M_head_impl)->field_0x1b8 & 0xfb;
          iVar2 = SSL_SESSION_to_bytes
                            ((SSL_SESSION *)session,(uint8_t **)&local_a0,(size_t *)&local_20);
          local_e0[0] = (internal)(iVar2 != 0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)local_e0,
                       (AssertionResult *)"SSL_SESSION_to_bytes(session0, &s0_bytes, &s0_len)",
                       "false","true",pcVar3);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xd15,(char *)local_98);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_a8,(Message *)&local_d0);
            this_00 = &local_a8;
            goto LAB_0017d655;
          }
          local_a8._M_head_impl = local_a0._M_head_impl;
          iVar2 = SSL_SESSION_to_bytes(local_b8._M_head_impl,(uint8_t **)&local_18,&local_28);
          local_e0[0] = (internal)(iVar2 != 0);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)local_e0,
                       (AssertionResult *)"SSL_SESSION_to_bytes(session1.get(), &s1_bytes, &s1_len)"
                       ,"false","true",pcVar3);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_b0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xd18,(char *)local_98);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_b0,(Message *)&local_d0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
            if (local_98 != (undefined1  [8])&local_88) {
              operator_delete((void *)local_98,(ulong)(local_88._M_allocated_capacity + 1));
            }
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_d0.span_.data_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_d0.span_.data_ + 8))();
            }
            if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_d8,local_d8);
            }
          }
          else {
            local_b0._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
                 local_18._M_head_impl;
            local_e0 = (undefined1  [8])local_a0._M_head_impl;
            local_d8 = local_20;
            local_d0.span_.data_ = (uchar *)local_18._M_head_impl;
            local_d0.span_.size_ = local_28;
            testing::internal::CmpHelperEQ<Bytes,Bytes>
                      ((internal *)local_98,"Bytes(s0_bytes, s0_len)","Bytes(s1_bytes, s1_len)",
                       (Bytes *)local_e0,&local_d0);
            if (local_98[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_e0);
              if (pbStack_90 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = (pbStack_90->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xd1b,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_d0,(Message *)local_e0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
              if (local_e0 != (undefined1  [8])0x0) {
                (**(code **)(*(long *)local_e0 + 8))();
              }
            }
            if (pbStack_90 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_90,pbStack_90);
            }
            std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_b0);
          }
          std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_a8);
        }
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_b8);
      }
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_30);
      std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_c0);
      goto LAB_0017d7df;
    }
    testing::Message::Message((Message *)&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_e0,(AssertionResult *)"server_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xd05,(char *)local_98);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,(ulong)(local_88._M_allocated_capacity + 1));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_d0.span_.data_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_d0.span_.data_ + 8))();
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
LAB_0017d7df:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST(SSLTest, SessionDuplication) {
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  ASSERT_TRUE(client_ctx);
  ASSERT_TRUE(server_ctx);

  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx.get(),
                                     server_ctx.get()));

  SSL_SESSION *session0 = SSL_get_session(client.get());
  bssl::UniquePtr<SSL_SESSION> session1 =
      bssl::SSL_SESSION_dup(session0, SSL_SESSION_DUP_ALL);
  ASSERT_TRUE(session1);

  session1->not_resumable = false;

  uint8_t *s0_bytes, *s1_bytes;
  size_t s0_len, s1_len;

  ASSERT_TRUE(SSL_SESSION_to_bytes(session0, &s0_bytes, &s0_len));
  bssl::UniquePtr<uint8_t> free_s0(s0_bytes);

  ASSERT_TRUE(SSL_SESSION_to_bytes(session1.get(), &s1_bytes, &s1_len));
  bssl::UniquePtr<uint8_t> free_s1(s1_bytes);

  EXPECT_EQ(Bytes(s0_bytes, s0_len), Bytes(s1_bytes, s1_len));
}